

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

enable_if_t<std::is_base_of<interface_type,_std::decay_t<Impl2T<virtual_cloning_policy>_>_>::value,_void>
 __thiscall
poly::
vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>>>,std::integral_constant<bool,true>>>
::push_back<Impl2T<poly::virtual_cloning_policy>>
          (vector<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>>>,poly::delegate_cloning_policy<Interface,custom::Allocator<Interface,custom::AllocatorDescriptor<std::integral_constant<bool,false>,std::integral_constant<bool,false>,std::integral_constant<bool,true>,std::integral_constant<bool,true>,std::integral_constant<bool,false>>>,std::integral_constant<bool,true>>>
           *this,Impl2T<poly::virtual_cloning_policy> *obj)

{
  bool bVar1;
  
  bVar1 = vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
          ::can_construct_new_elem
                    ((vector<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_poly::delegate_cloning_policy<Interface,_custom::Allocator<Interface,_custom::AllocatorDescriptor<std::integral_constant<bool,_false>,_std::integral_constant<bool,_false>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_false>_>_>,_std::integral_constant<bool,_true>_>_>
                      *)this,0x100,0x40);
  if (bVar1) {
    push_back_new_elem<Impl2T<poly::virtual_cloning_policy>,Impl2T<poly::virtual_cloning_policy>>();
    return;
  }
  push_back_new_elem_w_storage_increase<Impl2T<poly::virtual_cloning_policy>,Impl2T<poly::virtual_cloning_policy>>
            (this,obj);
  return;
}

Assistant:

inline auto vector<I, A, C>::push_back(T&& obj)
    -> std::enable_if_t<std::is_base_of<interface_type, std::decay_t<T>>::value>
{
    using TT         = std::decay_t<T>;
    constexpr auto s = sizeof(TT);
    constexpr auto a = alignof(TT);
    if (!can_construct_new_elem(s, a)) {
        push_back_new_elem_w_storage_increase(type_tag<TT> {}, std::forward<T>(obj));
    } else {
        push_back_new_elem(type_tag<TT> {}, std::forward<T>(obj));
    }
}